

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  undefined4 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint3 uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined4 uVar26;
  char *hstring;
  uint uVar27;
  int iVar28;
  int iVar29;
  char *pcVar30;
  char *pcVar31;
  byte *pbVar32;
  FILE *pFVar33;
  size_t sVar34;
  char *pcVar35;
  char *pcVar36;
  char *pcVar37;
  size_t sVar38;
  byte *pbVar39;
  ulong uVar40;
  int extraout_EDX;
  int extraout_EDX_00;
  int nc;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int nc_00;
  long lVar41;
  ulong *puVar42;
  byte *pbVar43;
  uint uVar44;
  int iVar45;
  char *cheader;
  uint uVar46;
  FILE *pFVar47;
  ulong uVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int naxis2;
  char fitsline [81];
  int lpixhead;
  int npaxis1;
  int naxis4;
  int naxis3;
  int naxis1;
  int lenirafhead;
  int bitpix;
  int nax;
  int npaxis2;
  char endline [81];
  char *local_210;
  uint local_200;
  uint local_1fc;
  FILE *local_1f8;
  size_t *local_1f0;
  ulong local_1e8;
  ulong *local_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188;
  int *local_180;
  int local_178;
  int local_174;
  int local_170;
  uint local_16c;
  int local_168;
  uint local_164;
  uint local_160;
  int local_15c;
  ulong local_158;
  ulong local_150;
  char *local_148;
  int local_13c;
  char local_138 [254];
  undefined1 local_3a;
  
  *buffptr = (char *)0x0;
  *buffsize = 0;
  *filesize = 0;
  local_1e0 = buffsize;
  pcVar30 = irafrdhead(filename,(int *)&local_164);
  if (pcVar30 == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  builtin_strncpy(local_138,
                  "END                                                                             "
                  ,0x51);
  local_1f8 = (FILE *)buffptr;
  uVar27 = head_version(pcVar30);
  local_1f0 = filesize;
  if (uVar27 == 0) {
    ffpmsg("File not valid IRAF image header");
LAB_00194907:
    ffpmsg(filename);
    *status = 0x68;
  }
  else {
    iVar28 = local_164 - 0x7fe;
    bVar49 = uVar27 != 2;
    iVar29 = 0x51;
    if (bVar49) {
      iVar28 = local_164 - 0x804;
      iVar29 = 0xa2;
    }
    iVar29 = (iVar28 / iVar29) * 0x50;
    iVar29 = iVar29 + (int)((ulong)((long)(iVar29 + 0x780) * -0x49f49f49) >> 0x20) + 0x780;
    uVar46 = ((iVar29 >> 0xb) - (iVar29 >> 0x1f)) * 0xb40 + 0x3844;
    *local_1e0 = (long)(int)uVar46;
    local_1e8 = (ulong)local_164;
    pcVar31 = (char *)calloc((long)(int)uVar46,1);
    if (pcVar31 == (char *)0x0) {
      snprintf(local_1d8,0x51,"IRAF2FITS Cannot allocate %d-byte FITS header",(ulong)uVar46);
      filesize = local_1f0;
      goto LAB_00194907;
    }
    *(char **)local_1f8 = pcVar31;
    strncpy(pcVar31,local_138,0x50);
    local_1d8._0_2_ = 0x54;
    local_148 = pcVar31;
    hputc(pcVar31,"SIMPLE",local_1d8);
    pbVar32 = (byte *)(pcVar30 + 0x10);
    if (uVar27 == 2) {
      pbVar32 = (byte *)(pcVar30 + 10);
    }
    bVar2 = *pbVar32;
    swaphead = (int)(bVar2 != 0);
    swapdata = swaphead;
    if (uVar27 != 1) {
      uVar48 = (ulong)(bVar2 != 0);
      swapdata = CONCAT13(pcVar30[uVar48 * 3 + 0xe],
                          CONCAT12(pcVar30[uVar48 + 0xf],
                                   CONCAT11(pcVar30[0x10 - uVar48],
                                            pcVar30[(ulong)(bVar2 == 0) * 3 + 0xe])));
    }
    uVar48 = (ulong)(bVar2 != 0);
    pbVar43 = pbVar32 + 3;
    pbVar1 = pbVar32;
    if (bVar2 != 0) {
      pbVar43 = pbVar32;
      pbVar1 = pbVar32 + 3;
    }
    uVar13 = CONCAT12(pbVar32[uVar48 + 1],CONCAT11(pbVar32[2 - uVar48],*pbVar43));
    uVar46 = ((uint)*pbVar1 * 0x1000000 + (uint)uVar13) - 2;
    local_1fc = uVar27;
    if ((10 < uVar46) || ((0x63fU >> (uVar46 & 0x1f) & 1) == 0)) {
      snprintf(local_1d8,0x51,"Unsupported IRAF data type: %d",(ulong)CONCAT13(*pbVar1,uVar13));
      ffpmsg(local_1d8);
      filesize = local_1f0;
      goto LAB_00194907;
    }
    local_158 = (ulong)bVar49;
    uVar48 = (ulong)((uint)bVar49 * 2);
    local_180 = status;
    local_150 = uVar48;
    snprintf(local_1d8,0x1e,"%d",(ulong)*(uint *)(&DAT_001dbb6c + (ulong)uVar46 * 4));
    hstring = local_148;
    hputc(local_148,"BITPIX",local_1d8);
    hputcom(hstring,"BITPIX","IRAF .imh pixel type");
    pcVar35 = pcVar30 + uVar48 + 0x15;
    pcVar31 = pcVar30 + uVar48 + 0x13;
    pcVar37 = pcVar30 + uVar48 + 0x12;
    pcVar36 = pcVar30 + uVar48 + 0x14;
    if (swaphead == 1) {
      pcVar35 = pcVar30 + uVar48 + 0x12;
      pcVar31 = pcVar30 + uVar48 + 0x14;
      pcVar37 = pcVar30 + uVar48 + 0x15;
      pcVar36 = pcVar30 + uVar48 + 0x13;
    }
    uVar27 = CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35)));
    snprintf(local_1d8,0x1e,"%d",(ulong)uVar27);
    hputc(hstring,"NAXIS",local_1d8);
    hputcom(hstring,"NAXIS","IRAF .imh naxis");
    uVar48 = (ulong)(bVar49 + 0x16 + (uint)bVar49);
    pcVar31 = pcVar30 + uVar48 + 1;
    pcVar37 = pcVar30 + uVar48 + 3;
    pcVar35 = pcVar30 + uVar48;
    pcVar36 = pcVar30 + uVar48 + 2;
    if (swaphead != 1) {
      pcVar35 = pcVar37;
      pcVar36 = pcVar31;
      pcVar37 = pcVar30 + uVar48;
      pcVar31 = pcVar30 + uVar48 + 2;
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar36,CONCAT11(*pcVar31,*pcVar35))));
    hputc(hstring,"NAXIS1",local_1d8);
    hputcom(hstring,"NAXIS1","IRAF .imh image naxis[1]");
    if ((int)uVar27 < 2) {
      local_210 = hstring + 0x140;
      iVar29 = extraout_EDX;
    }
    else {
      pcVar35 = pcVar30 + uVar48 + 7;
      pcVar31 = pcVar30 + uVar48 + 5;
      pcVar37 = pcVar30 + uVar48 + 4;
      pcVar36 = pcVar30 + uVar48 + 6;
      if (swaphead == 1) {
        pcVar35 = pcVar30 + uVar48 + 4;
        pcVar31 = pcVar30 + uVar48 + 6;
        pcVar37 = pcVar30 + uVar48 + 7;
        pcVar36 = pcVar30 + uVar48 + 5;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NAXIS2",local_1d8);
      hputcom(hstring,"NAXIS2","IRAF .imh image naxis[2]");
      local_210 = hstring + 400;
      iVar29 = extraout_EDX_00;
    }
    if (2 < (int)uVar27) {
      pcVar35 = pcVar30 + uVar48 + 0xb;
      pcVar31 = pcVar30 + uVar48 + 9;
      pcVar37 = pcVar30 + uVar48 + 8;
      pcVar36 = pcVar30 + uVar48 + 10;
      if (swaphead == 1) {
        pcVar35 = pcVar30 + uVar48 + 8;
        pcVar31 = pcVar30 + uVar48 + 10;
        pcVar37 = pcVar30 + uVar48 + 0xb;
        pcVar36 = pcVar30 + uVar48 + 9;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NAXIS3",local_1d8);
      hputcom(hstring,"NAXIS3","IRAF .imh image naxis[3]");
      local_210 = local_210 + 0x50;
      iVar29 = extraout_EDX_01;
    }
    if (3 < (int)uVar27) {
      pcVar35 = pcVar30 + uVar48 + 0xf;
      pcVar31 = pcVar30 + uVar48 + 0xd;
      pcVar37 = pcVar30 + uVar48 + 0xc;
      pcVar36 = pcVar30 + uVar48 + 0xe;
      if (swaphead == 1) {
        pcVar35 = pcVar30 + uVar48 + 0xc;
        pcVar31 = pcVar30 + uVar48 + 0xe;
        pcVar37 = pcVar30 + uVar48 + 0xf;
        pcVar36 = pcVar30 + uVar48 + 0xd;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NAXIS4",local_1d8);
      hputcom(hstring,"NAXIS4","IRAF .imh image naxis[4]");
      local_210 = local_210 + 0x50;
      iVar29 = extraout_EDX_02;
    }
    if (local_1fc == 2) {
      pcVar31 = irafgetc(pcVar30,0x27e,0x17f);
    }
    else {
      pcVar31 = irafgetc2(pcVar30,0x2dc,iVar29);
    }
    iVar29 = (int)local_158;
    sVar34 = strlen(pcVar31);
    iVar28 = (int)sVar34;
    if (iVar28 < 8) {
      memset(pcVar31 + iVar28,0x20,(ulong)(7 - iVar28) + 1);
      pcVar31[8] = '\0';
    }
    hputs(hstring,"OBJECT",pcVar31);
    hputcom(hstring,"OBJECT","IRAF .imh title");
    free(pcVar31);
    uVar48 = (ulong)(iVar29 * 2 + 0x32);
    pcVar31 = pcVar30 + uVar48 + 1;
    pcVar37 = pcVar30 + uVar48 + 3;
    pcVar35 = pcVar30 + uVar48;
    pcVar36 = pcVar30 + uVar48 + 2;
    if (swaphead != 1) {
      pcVar35 = pcVar37;
      pcVar36 = pcVar31;
      pcVar37 = pcVar30 + uVar48;
      pcVar31 = pcVar30 + uVar48 + 2;
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar36,CONCAT11(*pcVar31,*pcVar35))));
    hputc(hstring,"NPAXIS1",local_1d8);
    hputcom(hstring,"NPAXIS1","IRAF .imh physical naxis[1]");
    if ((int)uVar27 < 2) {
      local_210 = local_210 + 0xa0;
    }
    else {
      pcVar35 = pcVar30 + uVar48 + 7;
      pcVar31 = pcVar30 + uVar48 + 5;
      pcVar37 = pcVar30 + uVar48 + 4;
      pcVar36 = pcVar30 + uVar48 + 6;
      if (swaphead == 1) {
        pcVar35 = pcVar30 + uVar48 + 4;
        pcVar31 = pcVar30 + uVar48 + 6;
        pcVar37 = pcVar30 + uVar48 + 7;
        pcVar36 = pcVar30 + uVar48 + 5;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NPAXIS2",local_1d8);
      hputcom(hstring,"NPAXIS2","IRAF .imh physical naxis[2]");
      local_210 = local_210 + 0xf0;
    }
    if (2 < (int)uVar27) {
      pcVar36 = pcVar30 + uVar48 + 9;
      uVar40 = uVar48 | 8;
      pcVar31 = pcVar30 + uVar40 + 3;
      pcVar35 = pcVar30 + uVar40;
      pcVar37 = pcVar30 + uVar40 + 2;
      if (swaphead != 1) {
        pcVar35 = pcVar31;
        pcVar37 = pcVar36;
        pcVar31 = pcVar30 + uVar40;
        pcVar36 = pcVar30 + uVar40 + 2;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar31,CONCAT12(*pcVar37,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NPAXIS3",local_1d8);
      hputcom(hstring,"NPAXIS3","IRAF .imh physical naxis[3]");
      local_210 = local_210 + 0x50;
    }
    if (3 < (int)uVar27) {
      pcVar35 = pcVar30 + uVar48 + 0xf;
      pcVar31 = pcVar30 + uVar48 + 0xd;
      pcVar37 = pcVar30 + uVar48 + 0xc;
      pcVar36 = pcVar30 + uVar48 + 0xe;
      if (swaphead == 1) {
        pcVar35 = pcVar30 + uVar48 + 0xc;
        pcVar31 = pcVar30 + uVar48 + 0xe;
        pcVar37 = pcVar30 + uVar48 + 0xf;
        pcVar36 = pcVar30 + uVar48 + 0xd;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar37,CONCAT12(*pcVar31,CONCAT11(*pcVar36,*pcVar35))));
      hputc(hstring,"NPAXIS4",local_1d8);
      hputcom(hstring,"NPAXIS4","IRAF .imh physical naxis[4]");
      local_210 = local_210 + 0x50;
    }
    hputs(hstring,"IMHFILE",filename);
    hputcom(hstring,"IMHFILE","IRAF header file name");
    uVar27 = local_1fc;
    if (local_1fc == 2) {
      pcVar31 = irafgetc(pcVar30,0x7e,0xff);
    }
    else {
      pcVar31 = irafgetc2(pcVar30,0x19c,nc_00);
    }
    iVar29 = strncmp(pcVar31,"HDR",3);
    if ((iVar29 == 0) && (pcVar37 = same_path(pcVar31,filename), pcVar37 != (char *)0x0)) {
      free(pcVar31);
      pcVar31 = pcVar37;
    }
    pcVar37 = strchr(pcVar31,0x2f);
    if (((pcVar37 == (char *)0x0) && (pcVar37 = strchr(pcVar31,0x24), pcVar37 == (char *)0x0)) &&
       (pcVar37 = same_path(pcVar31,filename), pcVar37 != (char *)0x0)) {
      free(pcVar31);
      pcVar31 = pcVar37;
    }
    uVar48 = local_150;
    lVar41 = local_150 + 0x56;
    pcVar36 = strchr(pcVar31,0x21);
    pcVar37 = pcVar31;
    if (pcVar36 != (char *)0x0) {
      pcVar37 = pcVar36 + 1;
    }
    hputs(hstring,"PIXFILE",pcVar37);
    free(pcVar31);
    hputcom(hstring,"PIXFILE","IRAF .pix pixel file");
    pbVar32 = (byte *)(pcVar30 + uVar48 + 0x57);
    pbVar1 = (byte *)(pcVar30 + uVar48 + 0x59);
    pbVar39 = (byte *)(pcVar30 + lVar41);
    pbVar43 = (byte *)(pcVar30 + uVar48 + 0x58);
    if (swaphead != 1) {
      pbVar39 = pbVar1;
      pbVar43 = pbVar32;
      pbVar1 = (byte *)(pcVar30 + lVar41);
      pbVar32 = (byte *)(pcVar30 + uVar48 + 0x58);
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)(((uint)*pbVar1 * 0x2000000 +
                     ((uint)*pbVar32 * 0x200 + (uint)*pbVar39 * 2 | (uint)*pbVar43 << 0x11)) - 2));
    hputc(hstring,"PIXOFF",local_1d8);
    hputcom(hstring,"PIXOFF","IRAF .pix pixel offset (Do not change!)");
    snprintf(local_1d8,0x1e,"%d",(ulong)uVar27);
    hputc(hstring,"IMHVER",local_1d8);
    hputcom(hstring,"IMHVER","IRAF .imh format version (1 or 2)");
    if (swapdata == 0) {
      local_1d8._0_2_ = 0x46;
    }
    else {
      local_1d8._0_2_ = 0x54;
    }
    hputc(hstring,"PIXSWAP",local_1d8);
    uVar48 = local_1e8;
    hputcom(hstring,"PIXSWAP","IRAF pixels, FITS byte orders differ if T");
    local_210 = local_210 + 400;
    local_188 = 0;
    if (uVar27 == 2) {
      local_198 = 0x2020202020202020;
      uStack_190 = 0x2020202020202020;
      local_1a8 = 0x2020202020202020;
      uStack_1a0 = 0x2020202020202020;
      local_1b8 = 0x2020202020202020;
      uStack_1b0 = 0x2020202020202020;
      local_1c8 = 0x2020202020202020;
      uStack_1c0 = 0x2020202020202020;
      local_1d8 = (undefined1  [8])0x2020202020202020;
      uStack_1d0 = 0x2020202020202020;
      if (0x7fe < (int)uVar48) {
        iVar29 = 0;
        uVar48 = 0x7fe;
        do {
          cVar3 = pcVar30[uVar48];
          if (cVar3 == '\n') {
            strncpy(local_210,local_1d8,0x50);
            uVar4 = local_1d8._0_4_;
            uVar26 = local_1d8._3_4_;
            local_1c8 = 0x2020202020202020;
            uStack_1c0 = 0x2020202020202020;
            local_1b8 = 0x2020202020202020;
            uStack_1b0 = 0x2020202020202020;
            local_1a8 = 0x2020202020202020;
            uStack_1a0 = 0x2020202020202020;
            local_198 = 0x2020202020202020;
            uStack_190 = 0x2020202020202020;
            local_1d8 = (undefined1  [8])0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            if (uVar26 != 0x20544345 || uVar4 != 0x454a424f) {
              local_210 = local_210 + 0x50;
            }
            iVar29 = 0;
          }
          else {
            if (cVar3 == '\0') break;
            if (0x50 < iVar29) {
              uVar4 = local_1d8._0_4_;
              if (local_1d8._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
                strncpy(local_210,local_1d8,0x50);
                local_210 = local_210 + 0x50;
                iVar29 = 9;
              }
              local_198 = 0x2020202020202020;
              uStack_190 = 0x2020202020202020;
              local_1a8 = 0x2020202020202020;
              uStack_1a0 = 0x2020202020202020;
              local_1b8 = 0x2020202020202020;
              uStack_1b0 = 0x2020202020202020;
              local_1c8 = 0x2020202020202020;
              uStack_1c0 = 0x2020202020202020;
              local_1d8 = (undefined1  [8])0x2020202020202020;
              uStack_1d0 = 0x2020202020202020;
            }
            if ((byte)(cVar3 - 0x21U) < 0x5e) {
              local_1d8[iVar29] = cVar3;
            }
            iVar29 = iVar29 + 1;
          }
          uVar48 = uVar48 + 1;
        } while (local_1e8 != uVar48);
      }
    }
    else {
      local_1d8 = (undefined1  [8])0x2020202020202020;
      uStack_1d0 = 0x2020202020202020;
      local_1c8 = 0x2020202020202020;
      uStack_1c0 = 0x2020202020202020;
      local_1b8 = 0x2020202020202020;
      uStack_1b0 = 0x2020202020202020;
      local_1a8 = 0x2020202020202020;
      uStack_1a0 = 0x2020202020202020;
      local_198 = 0x2020202020202020;
      uStack_190 = 0x2020202020202020;
      if (0x804 < (int)uVar48) {
        bVar49 = swaphead != 1;
        iVar29 = 0;
        lVar41 = 0x804;
        do {
          cVar3 = pcVar30[lVar41 + (ulong)bVar49];
          uVar4 = local_1d8._0_4_;
          if (cVar3 == '\n') {
            if (local_1d8._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
              strncpy(local_210,local_1d8,0x50);
              local_210 = local_210 + 0x50;
            }
            local_198 = 0x2020202020202020;
            uStack_190 = 0x2020202020202020;
            local_1a8 = 0x2020202020202020;
            uStack_1a0 = 0x2020202020202020;
            local_1b8 = 0x2020202020202020;
            uStack_1b0 = 0x2020202020202020;
            local_1c8 = 0x2020202020202020;
            uStack_1c0 = 0x2020202020202020;
            local_1d8 = (undefined1  [8])0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            iVar29 = 0;
          }
          else {
            if (cVar3 == '\0') break;
            if (0x50 < iVar29) {
              if (local_1d8._3_4_ != 0x20544345 || uVar4 != 0x454a424f) {
                strncpy(local_210,local_1d8,0x50);
                local_210 = local_210 + 0x50;
                iVar29 = 9;
              }
              local_198 = 0x2020202020202020;
              uStack_190 = 0x2020202020202020;
              local_1a8 = 0x2020202020202020;
              uStack_1a0 = 0x2020202020202020;
              local_1b8 = 0x2020202020202020;
              uStack_1b0 = 0x2020202020202020;
              local_1c8 = 0x2020202020202020;
              uStack_1c0 = 0x2020202020202020;
              local_1d8 = (undefined1  [8])0x2020202020202020;
              uStack_1d0 = 0x2020202020202020;
            }
            if ((byte)(cVar3 - 0x21U) < 0x5e) {
              local_1d8[iVar29] = cVar3;
            }
            iVar29 = iVar29 + 1;
          }
          lVar41 = lVar41 + 2;
        } while ((int)lVar41 < (int)local_1e8);
      }
    }
    strncpy(local_210,local_138,0x50);
    pcVar31 = ksearch(hstring,"END");
    status = local_180;
    filesize = local_1f0;
    uVar48 = *local_1e0;
    pcVar31 = pcVar31 + 0x50;
    *local_1f0 = (long)pcVar31 - (long)hstring;
    local_138[2] = 0x20;
    local_138[0] = ' ';
    local_138[1] = ' ';
    if (pcVar31 < hstring + (int)(uVar48 / 0xb40) * 0xb40) {
      do {
        strncpy(pcVar31,local_138,0x50);
        pcVar31 = pcVar31 + 0x50;
      } while (pcVar31 < hstring + (int)(uVar48 / 0xb40) * 0xb40);
    }
  }
  free(pcVar30);
  pFVar47 = local_1f8;
  if (0 < *status) {
    return *status;
  }
  *filesize = ((*filesize - 1) / 0xb40) * 0xb40 + 0xb40;
  local_15c = 1;
  local_168 = 1;
  local_200 = 1;
  local_16c = 1;
  local_170 = 1;
  local_174 = 1;
  local_178 = 0;
  pcVar30 = *(char **)local_1f8;
  pcVar31 = hgetc(pcVar30,"PIXFILE");
  if (pcVar31 != (char *)0x0) {
    sVar34 = strlen(pcVar31);
    if ((int)sVar34 < 0xff) {
      strcpy(local_138,pcVar31);
    }
    else {
      strncpy(local_138,pcVar31,0xfe);
      local_3a = 0;
      pFVar47 = local_1f8;
    }
  }
  hgeti4(pcVar30,"PIXOFF",&local_178);
  pcVar37 = strchr(local_138,0x21);
  pcVar31 = pcVar37 + 1;
  if (pcVar37 == (char *)0x0) {
    pcVar31 = local_138;
  }
  pFVar33 = fopen64(pcVar31,"rb");
  iVar29 = local_178;
  if (pFVar33 == (FILE *)0x0) {
    ffpmsg("IRAFRIMAGE: Cannot open IRAF pixel file:");
    ffpmsg(local_138);
    local_180 = status;
  }
  else {
    sVar34 = (size_t)local_178;
    pcVar31 = (char *)calloc(sVar34,1);
    if (pcVar31 == (char *)0x0) {
      ffpmsg("IRAFRIMAGE: Cannot alloc memory for pixel header");
      ffpmsg(local_138);
    }
    else {
      sVar34 = fread(pcVar31,1,sVar34,pFVar33);
      if ((int)sVar34 < iVar29) {
        pcVar30 = local_1d8;
        snprintf(pcVar30,0x51,"IRAF pixel file: %d / %d bytes read.",sVar34 & 0xffffffff,0x400);
      }
      else {
        iVar29 = irafncmp(pcVar31,"impix",nc);
        if ((iVar29 == 0) || (iVar29 = strncmp(pcVar31,"impv2",5), iVar29 == 0)) {
          free(pcVar31);
          hgeti4(pcVar30,"NAXIS",&local_15c);
          hgeti4(pcVar30,"NAXIS1",&local_168);
          hgeti4(pcVar30,"NPAXIS1",&local_174);
          iVar29 = local_15c;
          if (1 < local_15c) {
            hgeti4(pcVar30,"NAXIS2",(int *)&local_200);
            hgeti4(pcVar30,"NPAXIS2",&local_13c);
          }
          if (2 < iVar29) {
            hgeti4(pcVar30,"NAXIS3",(int *)&local_16c);
          }
          local_1f8 = pFVar33;
          local_180 = status;
          if (3 < iVar29) {
            hgeti4(pcVar30,"NAXIS4",&local_170);
          }
          hgeti4(pcVar30,"BITPIX",(int *)&local_160);
          iVar29 = local_168;
          uVar27 = local_16c;
          uVar46 = -local_160;
          if (0 < (int)local_160) {
            uVar46 = local_160;
          }
          iVar45 = (uVar46 >> 3) * local_168;
          iVar28 = local_200 * local_16c * iVar45 * local_170;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar28);
          sVar34 = (size_t)iVar28;
          uVar48 = (((*local_1f0 + sVar34) - 1) / 0xb40) * 0xb40 + 0xb40;
          uVar44 = local_200;
          if (*local_1e0 < uVar48) {
            local_1fc = local_200;
            pcVar30 = (char *)realloc(*(char **)pFVar47,uVar48);
            uVar44 = local_1fc;
            if (pcVar30 == (char *)0x0) {
              snprintf(local_1d8,0x51,"IRAFRIMAGE Cannot allocate %d-byte image buffer",
                       (ulong)(uint)*local_1f0);
              ffpmsg(local_1d8);
              ffpmsg(local_138);
              fclose(local_1f8);
              goto LAB_00194b29;
            }
          }
          pFVar33 = local_1f8;
          *(char **)pFVar47 = pcVar30;
          *local_1e0 = uVar48;
          puVar42 = (ulong *)(pcVar30 + *local_1f0);
          *local_1f0 = uVar48;
          iVar29 = local_174 - iVar29;
          local_1e0 = puVar42;
          if (iVar29 == 0) {
            sVar38 = fread(puVar42,1,sVar34,local_1f8);
            uVar27 = (uint)sVar38;
          }
          else {
            if (1 < (int)uVar27 && uVar44 == 1) {
              local_200 = uVar27;
            }
            if ((int)local_200 < 1) {
              uVar27 = 0;
            }
            else {
              iVar28 = 0;
              uVar27 = 0;
              do {
                sVar38 = fread(puVar42,1,(long)iVar45,pFVar33);
                uVar27 = uVar27 + (int)sVar38;
                fseek(pFVar33,(long)(int)(iVar29 * (uVar46 >> 3)),1);
                puVar42 = (ulong *)((long)puVar42 + (long)iVar45);
                iVar28 = iVar28 + 1;
              } while (iVar28 < (int)local_200);
            }
          }
          fclose(pFVar33);
          if ((int)local_1e8 <= (int)uVar27) {
            if (swapdata != 0) {
              switch(local_160 << 0x1c | local_160 + 0x40 >> 4) {
              case 0:
                if (7 < (int)local_1e8) {
                  puVar42 = (ulong *)(sVar34 + (long)local_1e0);
                  do {
                    uVar48 = *local_1e0;
                    auVar14._8_6_ = 0;
                    auVar14._0_8_ = uVar48;
                    auVar14[0xe] = (char)(uVar48 >> 0x38);
                    auVar15._8_4_ = 0;
                    auVar15._0_8_ = uVar48;
                    auVar15[0xc] = (char)(uVar48 >> 0x30);
                    auVar15._13_2_ = auVar14._13_2_;
                    auVar16._8_4_ = 0;
                    auVar16._0_8_ = uVar48;
                    auVar16._12_3_ = auVar15._12_3_;
                    auVar17._8_2_ = 0;
                    auVar17._0_8_ = uVar48;
                    auVar17[10] = (char)(uVar48 >> 0x28);
                    auVar17._11_4_ = auVar16._11_4_;
                    auVar18._8_2_ = 0;
                    auVar18._0_8_ = uVar48;
                    auVar18._10_5_ = auVar17._10_5_;
                    auVar19[8] = (char)(uVar48 >> 0x20);
                    auVar19._0_8_ = uVar48;
                    auVar19._9_6_ = auVar18._9_6_;
                    auVar50[7] = 0;
                    auVar50._0_7_ = auVar19._8_7_;
                    auVar22._7_8_ = 0;
                    auVar22._0_7_ = auVar19._8_7_;
                    auVar24._1_8_ = SUB158(auVar22 << 0x40,7);
                    auVar24[0] = (char)(uVar48 >> 0x18);
                    auVar24._9_6_ = 0;
                    auVar23._1_10_ = SUB1510(auVar24 << 0x30,5);
                    auVar23[0] = (char)(uVar48 >> 0x10);
                    auVar25._11_4_ = 0;
                    auVar25._0_11_ = auVar23;
                    auVar20[2] = (char)(uVar48 >> 8);
                    auVar20._0_2_ = (ushort)uVar48;
                    auVar20._3_12_ = SUB1512(auVar25 << 0x20,3);
                    auVar21._2_13_ = auVar20._2_13_;
                    auVar21._0_2_ = (ushort)uVar48 & 0xff;
                    auVar50._8_4_ = auVar21._0_4_;
                    auVar50._12_4_ = auVar23._0_4_;
                    auVar52 = pshuflw(auVar50,auVar50,0x1b);
                    auVar52 = pshufhw(auVar52,auVar52,0x1b);
                    sVar5 = auVar52._0_2_;
                    sVar6 = auVar52._2_2_;
                    sVar7 = auVar52._4_2_;
                    sVar8 = auVar52._6_2_;
                    sVar9 = auVar52._8_2_;
                    sVar10 = auVar52._10_2_;
                    sVar11 = auVar52._12_2_;
                    sVar12 = auVar52._14_2_;
                    *local_1e0 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar52[0xe] -
                                          (0xff < sVar12),
                                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar52[0xc] -
                                                   (0xff < sVar11),
                                                   CONCAT15((0 < sVar10) * (sVar10 < 0x100) *
                                                            auVar52[10] - (0xff < sVar10),
                                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) *
                                                                     auVar52[8] - (0xff < sVar9),
                                                                     CONCAT13((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              auVar52[6] -
                                                                              (0xff < sVar8),
                                                                              CONCAT12((0 < sVar7) *
                                                                                       (sVar7 < 
                                                  0x100) * auVar52[4] - (0xff < sVar7),
                                                  CONCAT11((0 < sVar6) * (sVar6 < 0x100) *
                                                           auVar52[2] - (0xff < sVar6),
                                                           (0 < sVar5) * (sVar5 < 0x100) *
                                                           auVar52[0] - (0xff < sVar5))))))));
                    local_1e0 = local_1e0 + 1;
                  } while (local_1e0 < puVar42);
                }
                break;
              case 2:
                if (3 < (int)local_1e8) {
                  puVar42 = (ulong *)(sVar34 + (long)local_1e0);
                  do {
                    uVar4 = (undefined4)*local_1e0;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                                  CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4))
                                               >> 0x10),(short)uVar4) & 0xffff00ff00ff00ff;
                    auVar52 = pshuflw(auVar51,auVar51,0x1b);
                    sVar5 = auVar52._0_2_;
                    sVar6 = auVar52._2_2_;
                    sVar7 = auVar52._4_2_;
                    sVar8 = auVar52._6_2_;
                    *(uint *)local_1e0 =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar52[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar52[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar52[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar52[0] -
                                                    (0xff < sVar5))));
                    local_1e0 = (ulong *)((long)local_1e0 + 4);
                  } while (local_1e0 < puVar42);
                }
                break;
              case 3:
                if (1 < (int)local_1e8) {
                  puVar42 = (ulong *)(sVar34 + (long)local_1e0);
                  do {
                    *(ushort *)local_1e0 = (short)*local_1e0 << 8 | (ushort)*local_1e0 >> 8;
                    local_1e0 = (ulong *)((long)local_1e0 + 2);
                  } while (local_1e0 < puVar42);
                }
                break;
              case 5:
                if (1 < (int)local_1e8) {
                  puVar42 = (ulong *)(sVar34 + (long)local_1e0);
                  do {
                    *(ushort *)local_1e0 = (short)*local_1e0 << 8 | (ushort)*local_1e0 >> 8;
                    local_1e0 = (ulong *)((long)local_1e0 + 2);
                  } while (local_1e0 < puVar42);
                }
                break;
              case 6:
                if (3 < (int)local_1e8) {
                  puVar42 = (ulong *)(sVar34 + (long)local_1e0);
                  do {
                    uVar4 = (undefined4)*local_1e0;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                                  CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4))
                                               >> 0x10),(short)uVar4) & 0xffff00ff00ff00ff;
                    auVar52 = pshuflw(auVar52,auVar52,0x1b);
                    sVar5 = auVar52._0_2_;
                    sVar6 = auVar52._2_2_;
                    sVar7 = auVar52._4_2_;
                    sVar8 = auVar52._6_2_;
                    *(uint *)local_1e0 =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar52[6] - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar52[4] -
                                           (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar52[2] -
                                                    (0xff < sVar6),
                                                    (0 < sVar5) * (sVar5 < 0x100) * auVar52[0] -
                                                    (0xff < sVar5))));
                    local_1e0 = (ulong *)((long)local_1e0 + 4);
                  } while (local_1e0 < puVar42);
                }
              }
            }
            goto switchD_001958a9_caseD_1;
          }
          snprintf(local_1d8,0x51,"IRAF pixel file: %d / %d bytes read.",(ulong)uVar27);
          ffpmsg(local_1d8);
          ffpmsg(local_138);
          goto LAB_00194b29;
        }
        ffpmsg("File not valid IRAF pixel file:");
        pcVar30 = local_138;
      }
      ffpmsg(pcVar30);
      free(pcVar31);
    }
    fclose(pFVar33);
    local_180 = status;
  }
LAB_00194b29:
  *local_180 = 0x68;
switchD_001958a9_caseD_1:
  return *local_180;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}